

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void __thiscall rsg::ValueRange::ValueRange(ValueRange *this,ConstValueRangeAccess other)

{
  int iVar1;
  VariableType *pVVar2;
  ConstStridedValueAccess<1> local_80;
  ConstValueAccess local_70;
  StridedValueRead<1> local_60;
  ConstStridedValueAccess<1> local_50;
  ConstValueAccess local_40;
  StridedValueRead<1> local_30;
  allocator<rsg::Scalar> local_1e;
  allocator<rsg::Scalar> local_1d [13];
  ValueRange *local_10;
  ValueRange *this_local;
  
  local_10 = this;
  pVVar2 = ConstValueRangeAccess::getType(&other);
  VariableType::VariableType(&this->m_type,pVVar2);
  pVVar2 = ConstValueRangeAccess::getType(&other);
  iVar1 = VariableType::getScalarSize(pVVar2);
  std::allocator<rsg::Scalar>::allocator(local_1d);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar1,local_1d);
  std::allocator<rsg::Scalar>::~allocator(local_1d);
  pVVar2 = ConstValueRangeAccess::getType(&other);
  iVar1 = VariableType::getScalarSize(pVVar2);
  std::allocator<rsg::Scalar>::allocator(&local_1e);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar1,&local_1e)
  ;
  std::allocator<rsg::Scalar>::~allocator(&local_1e);
  local_40 = ConstValueRangeAccess::getMin(&other);
  local_30 = ConstStridedValueAccess<1>::value(&local_40);
  local_50 = (ConstStridedValueAccess<1>)getMin(this);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_50,&local_30);
  local_70 = ConstValueRangeAccess::getMax(&other);
  local_60 = ConstStridedValueAccess<1>::value(&local_70);
  local_80 = (ConstStridedValueAccess<1>)getMax(this);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_80,&local_60);
  return;
}

Assistant:

ValueRange::ValueRange (ConstValueRangeAccess other)
	: m_type		(other.getType())
	, m_min			(other.getType().getScalarSize())
	, m_max			(other.getType().getScalarSize())
{
	getMin() = other.getMin().value();
	getMax() = other.getMax().value();
}